

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseExpr(WastParser *this,ExprList *exprs)

{
  Expr *pEVar1;
  Expr *pEVar2;
  Expr *pEVar3;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> uVar4;
  bool bVar5;
  TokenType TVar6;
  Result RVar7;
  Result RVar8;
  Expr *pEVar9;
  TryExpr *this_00;
  _Head_base<0UL,_wabt::Expr_*,_false> _Var10;
  ExprList *pEVar11;
  long *plVar12;
  long lVar13;
  iterator pos;
  ExprList cond;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> expr;
  Location loc;
  undefined1 local_108 [32];
  Expr *local_e8 [2];
  undefined1 local_d8 [16];
  long local_c8 [4];
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  Location local_88;
  ExprList *local_60;
  _Head_base<0UL,_wabt::Expr_*,_false> local_58;
  _Head_base<0UL,_wabt::Expr_*,_false> local_50;
  _Head_base<0UL,_wabt::Expr_*,_false> local_48;
  _Head_base<0UL,_wabt::Expr_*,_false> local_40;
  _Head_base<0UL,_wabt::Expr_*,_false> local_38;
  
  TVar6 = Peek(this,0);
  RVar8.enum_ = Error;
  if (TVar6 != Lpar) {
    return (Result)Error;
  }
  TVar6 = Peek(this,1);
  bVar5 = anon_unknown_1::IsPlainInstr(TVar6);
  if (!bVar5) {
    GetToken((Token *)local_108,this);
    local_88.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_108._16_8_;
    local_88.field_1._8_8_ = local_108._24_8_;
    local_88.filename._M_len = local_108._0_8_;
    local_88.filename._M_str = (char *)local_108._8_8_;
    TVar6 = Peek(this,1);
    if ((int)TVar6 < 0x5f) {
      if (TVar6 == Block) {
        Consume((Token *)local_108,this);
        Consume((Token *)local_108,this);
        pEVar9 = (Expr *)operator_new(0x118);
        (pEVar9->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
        (pEVar9->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
        pEVar9->_vptr_Expr = (_func_int **)&PTR__Expr_001a3df8;
        (pEVar9->loc).filename._M_len = local_88.filename._M_len;
        (pEVar9->loc).filename._M_str = local_88.filename._M_str;
        (pEVar9->loc).field_1.field_1.offset = (size_t)local_88.field_1.field_1.offset;
        *(undefined8 *)((long)&(pEVar9->loc).field_1 + 8) = local_88.field_1._8_8_;
        pEVar9->type_ = Block;
        pEVar9->_vptr_Expr = (_func_int **)&PTR__BlockExprBase_001a57e0;
        pEVar9[1]._vptr_Expr = (_func_int **)&pEVar9[1].super_intrusive_list_base<wabt::Expr>.prev_;
        pEVar9[1].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)0x0;
        bVar5 = false;
        *(undefined1 *)&pEVar9[1].super_intrusive_list_base<wabt::Expr>.prev_ = 0;
        *(undefined1 *)&pEVar9[1].loc.filename._M_str = 0;
        Var::Var((Var *)&pEVar9[1].loc.field_1.field_0);
        pEVar9[4]._vptr_Expr = (_func_int **)0x0;
        pEVar9[4].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)0x0;
        *(undefined8 *)((long)&pEVar9[3].loc.field_1 + 8) = 0;
        *(undefined8 *)&pEVar9[3].type_ = 0;
        pEVar9[3].loc.filename._M_str = (char *)0x0;
        pEVar9[3].loc.field_1.field_1.offset = 0;
        pEVar9[3].super_intrusive_list_base<wabt::Expr>.prev_ = (Expr *)0x0;
        pEVar9[3].loc.filename._M_len = 0;
        pEVar9[3]._vptr_Expr = (_func_int **)0x0;
        pEVar9[3].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)0x0;
        *(undefined8 *)((long)&pEVar9[2].loc.field_1 + 8) = 0;
        *(undefined8 *)&pEVar9[2].type_ = 0;
        *(undefined4 *)&pEVar9[4].super_intrusive_list_base<wabt::Expr>.prev_ = 0;
        RVar8 = ParseLabelOpt(this,(string *)(pEVar9 + 1));
        if (RVar8.enum_ != Error) {
          RVar8 = ParseBlock(this,(Block *)(pEVar9 + 1));
          if (RVar8.enum_ == Error) goto LAB_001364fd;
          local_38._M_head_impl = pEVar9;
          intrusive_list<wabt::Expr>::push_back
                    (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_38);
          if (local_38._M_head_impl != (Expr *)0x0) {
            (*(local_38._M_head_impl)->_vptr_Expr[1])();
          }
          local_38._M_head_impl = (Expr *)0x0;
LAB_001365f3:
          bVar5 = true;
          pEVar9 = (Expr *)0x0;
        }
        goto LAB_001365f9;
      }
      if (TVar6 != If) {
LAB_00136c12:
        __assert_fail("!\"ParseExpr should only be called when IsExpr() is true\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                      ,0xcef,"Result wabt::WastParser::ParseExpr(ExprList *)");
      }
      Consume((Token *)local_108,this);
      Consume((Token *)local_108,this);
      pEVar9 = (Expr *)operator_new(0x150);
      (pEVar9->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
      (pEVar9->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
      pEVar9->_vptr_Expr = (_func_int **)&PTR__Expr_001a3df8;
      (pEVar9->loc).filename._M_len = local_88.filename._M_len;
      (pEVar9->loc).filename._M_str = local_88.filename._M_str;
      (pEVar9->loc).field_1.field_1.offset = (size_t)local_88.field_1.field_1.offset;
      *(undefined8 *)((long)&(pEVar9->loc).field_1 + 8) = local_88.field_1._8_8_;
      pEVar9->type_ = If;
      pEVar9->_vptr_Expr = (_func_int **)&PTR__IfExpr_001a5880;
      pEVar9[1]._vptr_Expr = (_func_int **)&pEVar9[1].super_intrusive_list_base<wabt::Expr>.prev_;
      pEVar9[1].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)0x0;
      bVar5 = false;
      *(undefined1 *)&pEVar9[1].super_intrusive_list_base<wabt::Expr>.prev_ = 0;
      *(undefined1 *)&pEVar9[1].loc.filename._M_str = 0;
      Var::Var((Var *)&pEVar9[1].loc.field_1.field_0);
      *(undefined4 *)&pEVar9[4].super_intrusive_list_base<wabt::Expr>.prev_ = 0;
      pEVar9[4]._vptr_Expr = (_func_int **)0x0;
      pEVar9[4].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)0x0;
      *(undefined8 *)((long)&pEVar9[3].loc.field_1 + 8) = 0;
      *(undefined8 *)&pEVar9[3].type_ = 0;
      pEVar9[3].loc.filename._M_str = (char *)0x0;
      pEVar9[3].loc.field_1.field_1.offset = 0;
      pEVar9[3].super_intrusive_list_base<wabt::Expr>.prev_ = (Expr *)0x0;
      pEVar9[3].loc.filename._M_len = 0;
      pEVar9[3]._vptr_Expr = (_func_int **)0x0;
      pEVar9[3].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)0x0;
      *(undefined8 *)((long)&pEVar9[2].loc.field_1 + 8) = 0;
      *(undefined8 *)&pEVar9[2].type_ = 0;
      pEVar9[4].loc.filename._M_len = 0;
      pEVar9[4].loc.filename._M_str = (char *)0x0;
      pEVar9[4].loc.field_1.field_1.offset = 0;
      *(undefined8 *)((long)&pEVar9[4].loc.field_1 + 8) = 0;
      *(undefined8 *)&pEVar9[4].type_ = 0;
      pEVar9[5]._vptr_Expr = (_func_int **)0x0;
      *(undefined4 *)&pEVar9[5].super_intrusive_list_base<wabt::Expr>.next_ = 0;
      RVar7 = ParseLabelOpt(this,(string *)(pEVar9 + 1));
      RVar8.enum_ = Error;
      if (RVar7.enum_ != Error) {
        RVar7 = ParseBlockDeclaration(this,(BlockDeclaration *)&pEVar9[1].loc.filename._M_str);
        if (RVar7.enum_ == Error) {
LAB_001361b3:
          bVar5 = false;
        }
        else {
          local_60 = (ExprList *)&pEVar9[4].loc;
          do {
            bVar5 = PeekMatchExpr(this);
            if (!bVar5) {
              RVar7 = Expect(this,Lpar);
              if (RVar7.enum_ != Error) {
                bVar5 = Match(this,Then);
                if (bVar5) {
                  RVar7 = ParseTerminatingInstrList(this,(ExprList *)&pEVar9[3].loc.filename._M_str)
                  ;
                  if (RVar7.enum_ == Error) goto LAB_001361b3;
                  GetToken((Token *)local_108,this);
                  pEVar9[4].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)local_108._16_8_;
                  pEVar9[4].super_intrusive_list_base<wabt::Expr>.prev_ = (Expr *)local_108._24_8_;
                  *(undefined8 *)&pEVar9[3].type_ = local_108._0_8_;
                  pEVar9[4]._vptr_Expr = (_func_int **)local_108._8_8_;
                  RVar7 = Expect(this,Rpar);
                  if ((RVar7.enum_ == Error) ||
                     ((bVar5 = MatchLpar(this,Else), bVar5 &&
                      ((RVar7 = ParseTerminatingInstrList(this,local_60), RVar7.enum_ == Error ||
                       (RVar7 = Expect(this,Rpar), RVar7.enum_ == Error)))))) goto LAB_001361b3;
                  GetToken((Token *)local_108,this);
                  pEVar9[5]._vptr_Expr = (_func_int **)local_108._16_8_;
                  pEVar9[5].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)local_108._24_8_;
                  *(undefined8 *)((long)&pEVar9[4].loc.field_1 + 8) = local_108._0_8_;
                  *(undefined8 *)&pEVar9[4].type_ = local_108._8_8_;
                  local_48._M_head_impl = pEVar9;
                  intrusive_list<wabt::Expr>::push_back
                            (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                   &local_48);
                  if (local_48._M_head_impl != (Expr *)0x0) {
                    (*(local_48._M_head_impl)->_vptr_Expr[1])();
                  }
                  local_48._M_head_impl = (Expr *)0x0;
                  bVar5 = true;
                  pEVar9 = (Expr *)0x0;
                  goto LAB_00136950;
                }
                local_108._0_8_ = (Expr *)(local_108 + 0x10);
                std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"then block","")
                ;
                local_a8._M_t.super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
                _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
                     (__uniq_ptr_data<wabt::Expr,_std::default_delete<wabt::Expr>,_true,_true>)
                     (__uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>)0x0;
                uStack_a0._0_4_ = AtomicLoad;
                uStack_a0._4_4_ = 0;
                local_98 = 0;
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                _M_range_initialize<std::__cxx11::string_const*>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &local_a8,(string *)local_108,local_e8);
                RVar8 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            *)&local_a8,"(then ...)");
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_a8);
                if ((Expr *)local_108._0_8_ != (Expr *)(local_108 + 0x10)) {
                  operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
                }
              }
              break;
            }
            local_108._0_8_ = (Expr *)0x0;
            local_108._8_8_ = (Expr *)0x0;
            local_108._16_8_ = 0;
            RVar7 = ParseExpr(this,(ExprList *)local_108);
            _Var10._M_head_impl = (Expr *)local_108._0_8_;
            pEVar2 = (Expr *)local_108._0_8_;
            if (RVar7.enum_ != Error) {
              while (pEVar2 = (Expr *)local_108._0_8_,
                    (_Head_base<0UL,_wabt::Expr_*,_false>)_Var10._M_head_impl !=
                    (_Head_base<0UL,_wabt::Expr_*,_false>)0x0) {
                if (local_108._16_8_ == 0) {
                  __assert_fail("!empty()",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/intrusive-list.h"
                                ,0x221,
                                "std::unique_ptr<T> wabt::intrusive_list<wabt::Expr>::extract(iterator) [T = wabt::Expr]"
                               );
                }
                pEVar2 = ((_Var10._M_head_impl)->super_intrusive_list_base<wabt::Expr>).next_;
                if (local_108._0_8_ == local_108._8_8_) {
                  local_108._0_8_ = (Expr *)0x0;
                  local_108._8_8_ = (Expr *)0x0;
                  pEVar1 = (Expr *)local_108._8_8_;
                }
                else {
                  pEVar1 = ((_Var10._M_head_impl)->super_intrusive_list_base<wabt::Expr>).prev_;
                  pEVar3 = pEVar2;
                  if (pEVar1 != (Expr *)0x0) {
                    (pEVar1->super_intrusive_list_base<wabt::Expr>).next_ = pEVar2;
                    pEVar3 = (Expr *)local_108._0_8_;
                  }
                  local_108._0_8_ = pEVar3;
                  pEVar3 = ((_Var10._M_head_impl)->super_intrusive_list_base<wabt::Expr>).next_;
                  if (pEVar3 != (Expr *)0x0) {
                    (pEVar3->super_intrusive_list_base<wabt::Expr>).prev_ = pEVar1;
                    pEVar1 = (Expr *)local_108._8_8_;
                  }
                }
                local_108._8_8_ = pEVar1;
                local_108._16_8_ = local_108._16_8_ - 1;
                ((_Var10._M_head_impl)->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
                ((_Var10._M_head_impl)->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
                pos.node_ = (Expr *)0x0;
                pos.list_ = exprs;
                local_a8._M_t.super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
                _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
                     (__uniq_ptr_data<wabt::Expr,_std::default_delete<wabt::Expr>,_true,_true>)
                     (__uniq_ptr_data<wabt::Expr,_std::default_delete<wabt::Expr>,_true,_true>)
                     _Var10._M_head_impl;
                intrusive_list<wabt::Expr>::insert(exprs,pos,&local_a8);
                if ((_Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>)
                    local_a8._M_t.
                    super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
                    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl != (Expr *)0x0) {
                  (**(code **)(*(long *)local_a8._M_t.
                                        super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>
                                        .super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 8
                              ))();
                }
                local_a8._M_t.super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
                _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
                     (__uniq_ptr_data<wabt::Expr,_std::default_delete<wabt::Expr>,_true,_true>)
                     (__uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>)0x0;
                _Var10._M_head_impl = pEVar2;
              }
            }
            while (pEVar2 != (Expr *)0x0) {
              pEVar1 = (pEVar2->super_intrusive_list_base<wabt::Expr>).next_;
              (*pEVar2->_vptr_Expr[1])();
              pEVar2 = pEVar1;
            }
          } while (RVar7.enum_ != Error);
          bVar5 = false;
        }
      }
LAB_00136950:
      if (pEVar9 != (Expr *)0x0) {
        (*pEVar9->_vptr_Expr[1])(pEVar9);
      }
joined_r0x00136961:
      if (bVar5) {
LAB_00136967:
        bVar5 = true;
        goto joined_r0x00136b1d;
      }
    }
    else {
      if (TVar6 == Loop) {
        Consume((Token *)local_108,this);
        Consume((Token *)local_108,this);
        pEVar9 = (Expr *)operator_new(0x118);
        (pEVar9->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
        (pEVar9->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
        pEVar9->_vptr_Expr = (_func_int **)&PTR__Expr_001a3df8;
        (pEVar9->loc).filename._M_len = local_88.filename._M_len;
        (pEVar9->loc).filename._M_str = local_88.filename._M_str;
        (pEVar9->loc).field_1.field_1.offset = (size_t)local_88.field_1.field_1.offset;
        *(undefined8 *)((long)&(pEVar9->loc).field_1 + 8) = local_88.field_1._8_8_;
        pEVar9->type_ = Loop;
        pEVar9->_vptr_Expr = (_func_int **)&PTR__BlockExprBase_001a5830;
        pEVar9[1]._vptr_Expr = (_func_int **)&pEVar9[1].super_intrusive_list_base<wabt::Expr>.prev_;
        pEVar9[1].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)0x0;
        bVar5 = false;
        *(undefined1 *)&pEVar9[1].super_intrusive_list_base<wabt::Expr>.prev_ = 0;
        *(undefined1 *)&pEVar9[1].loc.filename._M_str = 0;
        Var::Var((Var *)&pEVar9[1].loc.field_1.field_0);
        pEVar9[4]._vptr_Expr = (_func_int **)0x0;
        pEVar9[4].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)0x0;
        *(undefined8 *)((long)&pEVar9[3].loc.field_1 + 8) = 0;
        *(undefined8 *)&pEVar9[3].type_ = 0;
        pEVar9[3].loc.filename._M_str = (char *)0x0;
        pEVar9[3].loc.field_1.field_1.offset = 0;
        pEVar9[3].super_intrusive_list_base<wabt::Expr>.prev_ = (Expr *)0x0;
        pEVar9[3].loc.filename._M_len = 0;
        pEVar9[3]._vptr_Expr = (_func_int **)0x0;
        pEVar9[3].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)0x0;
        *(undefined8 *)((long)&pEVar9[2].loc.field_1 + 8) = 0;
        *(undefined8 *)&pEVar9[2].type_ = 0;
        *(undefined4 *)&pEVar9[4].super_intrusive_list_base<wabt::Expr>.prev_ = 0;
        RVar8 = ParseLabelOpt(this,(string *)(pEVar9 + 1));
        if (RVar8.enum_ != Error) {
          RVar8 = ParseBlock(this,(Block *)(pEVar9 + 1));
          if (RVar8.enum_ != Error) {
            local_40._M_head_impl = pEVar9;
            intrusive_list<wabt::Expr>::push_back
                      (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_40);
            if (local_40._M_head_impl != (Expr *)0x0) {
              (*(local_40._M_head_impl)->_vptr_Expr[1])();
            }
            local_40._M_head_impl = (Expr *)0x0;
            goto LAB_001365f3;
          }
LAB_001364fd:
          bVar5 = false;
        }
LAB_001365f9:
        if (pEVar9 != (Expr *)0x0) {
          (*pEVar9->_vptr_Expr[1])(pEVar9);
        }
        RVar8.enum_ = Error;
        goto joined_r0x00136961;
      }
      if (TVar6 == Try) {
        Consume((Token *)local_108,this);
        Consume((Token *)local_108,this);
        ErrorUnlessOpcodeEnabled(this,(Token *)local_108);
        this_00 = (TryExpr *)operator_new(0x178);
        TryExpr::TryExpr(this_00,&local_88);
        RVar8 = ParseLabelOpt(this,&(this_00->block).label);
        if (((((RVar8.enum_ == Error) ||
              (RVar8 = ParseBlockDeclaration(this,&(this_00->block).decl), RVar8.enum_ == Error)) ||
             (RVar8 = Expect(this,Lpar), RVar8.enum_ == Error)) ||
            ((RVar8 = Expect(this,Do), RVar8.enum_ == Error ||
             (RVar8 = ParseInstrList(this,&(this_00->block).exprs), RVar8.enum_ == Error)))) ||
           (RVar8 = Expect(this,Rpar), RVar8.enum_ == Error)) goto LAB_00136afa;
        TVar6 = Peek(this,0);
        if (TVar6 == Lpar) {
          Consume((Token *)local_108,this);
          TVar6 = Peek(this,0);
          if (TVar6 - Catch < 2) {
            RVar8 = ParseCatchExprList(this,&this_00->catches);
            if (RVar8.enum_ == Error) goto LAB_00136afa;
            this_00->kind = Catch;
            goto LAB_00136a76;
          }
          if (TVar6 != Delegate) {
            local_108._0_8_ = local_108 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"catch","");
            local_e8[0] = (Expr *)local_d8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"catch_all","");
            plVar12 = local_c8 + 2;
            local_c8[0] = (long)plVar12;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"delegate","");
            local_a8._M_t.super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
            super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
            super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
                 (__uniq_ptr_data<wabt::Expr,_std::default_delete<wabt::Expr>,_true,_true>)
                 (__uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>)0x0;
            uStack_a0._0_4_ = AtomicLoad;
            uStack_a0._4_4_ = 0;
            local_98 = 0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            _M_range_initialize<std::__cxx11::string_const*>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_a8,(string *)local_108,&local_a8);
            ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_a8,(char *)0x0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_a8);
            lVar13 = -0x60;
            do {
              if (plVar12 != (long *)plVar12[-2]) {
                operator_delete((long *)plVar12[-2],*plVar12 + 1);
              }
              plVar12 = plVar12 + -4;
              lVar13 = lVar13 + 0x20;
            } while (lVar13 != 0);
            goto LAB_00136a76;
          }
          Consume((Token *)local_108,this);
          Var::Var((Var *)local_108);
          RVar8 = ParseVar(this,(Var *)local_108);
          if (RVar8.enum_ == Error) {
            Var::~Var((Var *)local_108);
          }
          else {
            Var::operator=(&this_00->delegate_target,(Var *)local_108);
            this_00->kind = Delegate;
            RVar8 = Expect(this,Rpar);
            Var::~Var((Var *)local_108);
            if (RVar8.enum_ != Error) goto LAB_00136a76;
          }
LAB_00136afa:
          bVar5 = false;
        }
        else {
LAB_00136a76:
          local_108._0_8_ = local_108 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_108,"a valid try clause","");
          local_a8._M_t.super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
          super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
               (__uniq_ptr_data<wabt::Expr,_std::default_delete<wabt::Expr>,_true,_true>)
               (__uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>)0x0;
          uStack_a0._0_4_ = AtomicLoad;
          uStack_a0._4_4_ = 0;
          local_98 = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_range_initialize<std::__cxx11::string_const*>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_a8,
                     (string *)local_108);
          RVar8 = ErrorIfLpar(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&local_a8,(char *)0x0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_a8);
          if ((Expr *)local_108._0_8_ != (Expr *)(local_108 + 0x10)) {
            operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
          }
          if (RVar8.enum_ == Error) goto LAB_00136afa;
          GetToken((Token *)local_108,this);
          (this_00->block).end_loc.field_1.field_1.offset = local_108._16_8_;
          *(undefined8 *)((long)&(this_00->block).end_loc.field_1 + 8) = local_108._24_8_;
          (this_00->block).end_loc.filename._M_len = local_108._0_8_;
          (this_00->block).end_loc.filename._M_str = (char *)local_108._8_8_;
          local_50._M_head_impl = (Expr *)this_00;
          intrusive_list<wabt::Expr>::push_back
                    (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_50);
          if ((TryExpr *)local_50._M_head_impl != (TryExpr *)0x0) {
            (*(local_50._M_head_impl)->_vptr_Expr[1])();
          }
          local_50._M_head_impl = (Expr *)0x0;
          bVar5 = true;
          this_00 = (TryExpr *)0x0;
        }
        if (this_00 != (TryExpr *)0x0) {
          (**(code **)(*(long *)this_00 + 8))(this_00);
        }
        RVar8.enum_ = Error;
        goto joined_r0x00136961;
      }
      if (TVar6 != TryTable) goto LAB_00136c12;
      Consume((Token *)local_108,this);
      Consume((Token *)local_108,this);
      ErrorUnlessOpcodeEnabled(this,(Token *)local_108);
      pEVar9 = (Expr *)operator_new(0x130);
      (pEVar9->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
      (pEVar9->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
      pEVar9->_vptr_Expr = (_func_int **)&PTR__Expr_001a3df8;
      (pEVar9->loc).filename._M_len = local_88.filename._M_len;
      (pEVar9->loc).filename._M_str = local_88.filename._M_str;
      (pEVar9->loc).field_1.field_1.offset = (size_t)local_88.field_1.field_1.offset;
      *(undefined8 *)((long)&(pEVar9->loc).field_1 + 8) = local_88.field_1._8_8_;
      pEVar9->type_ = TryTable;
      pEVar9->_vptr_Expr = (_func_int **)&PTR__TryTableExpr_001a5920;
      pEVar9[1]._vptr_Expr = (_func_int **)&pEVar9[1].super_intrusive_list_base<wabt::Expr>.prev_;
      bVar5 = false;
      pEVar9[1].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)0x0;
      *(undefined1 *)&pEVar9[1].super_intrusive_list_base<wabt::Expr>.prev_ = 0;
      *(undefined1 *)&pEVar9[1].loc.filename._M_str = 0;
      Var::Var((Var *)&pEVar9[1].loc.field_1.field_0);
      pEVar9[4]._vptr_Expr = (_func_int **)0x0;
      pEVar9[4].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)0x0;
      *(undefined8 *)((long)&pEVar9[3].loc.field_1 + 8) = 0;
      *(undefined8 *)&pEVar9[3].type_ = 0;
      pEVar9[3].loc.filename._M_str = (char *)0x0;
      pEVar9[3].loc.field_1.field_1.offset = 0;
      pEVar9[3].super_intrusive_list_base<wabt::Expr>.prev_ = (Expr *)0x0;
      pEVar9[3].loc.filename._M_len = 0;
      pEVar9[3]._vptr_Expr = (_func_int **)0x0;
      pEVar9[3].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)0x0;
      *(undefined8 *)((long)&pEVar9[2].loc.field_1 + 8) = 0;
      *(undefined8 *)&pEVar9[2].type_ = 0;
      *(undefined4 *)&pEVar9[4].super_intrusive_list_base<wabt::Expr>.prev_ = 0;
      pEVar9[4].loc.filename._M_len = 0;
      pEVar9[4].loc.filename._M_str = (char *)0x0;
      pEVar9[4].loc.field_1.field_1.offset = 0;
      RVar8 = ParseLabelOpt(this,(string *)(pEVar9 + 1));
      if (RVar8.enum_ != Error) {
        RVar8 = ParseBlockDeclaration(this,(BlockDeclaration *)&pEVar9[1].loc.filename._M_str);
        if (((RVar8.enum_ == Error) ||
            (RVar8 = ParseTryTableCatches(this,(TryTableVector *)&pEVar9[4].loc),
            RVar8.enum_ == Error)) ||
           (RVar8 = ParseInstrList(this,(ExprList *)&pEVar9[3].loc.filename._M_str),
           RVar8.enum_ == Error)) {
          bVar5 = false;
        }
        else {
          GetToken((Token *)local_108,this);
          pEVar9[4].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)local_108._16_8_;
          pEVar9[4].super_intrusive_list_base<wabt::Expr>.prev_ = (Expr *)local_108._24_8_;
          *(undefined8 *)&pEVar9[3].type_ = local_108._0_8_;
          pEVar9[4]._vptr_Expr = (_func_int **)local_108._8_8_;
          local_58._M_head_impl = pEVar9;
          intrusive_list<wabt::Expr>::push_back
                    (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_58);
          if (local_58._M_head_impl != (Expr *)0x0) {
            (*(local_58._M_head_impl)->_vptr_Expr[1])();
          }
          local_58._M_head_impl = (Expr *)0x0;
          bVar5 = true;
          pEVar9 = (Expr *)0x0;
        }
      }
      if (pEVar9 != (Expr *)0x0) {
        (*pEVar9->_vptr_Expr[1])(pEVar9);
      }
      RVar8.enum_ = Error;
      if (bVar5) goto LAB_00136967;
    }
    bVar5 = false;
    goto joined_r0x00136b1d;
  }
  Consume((Token *)local_108,this);
  local_a8._M_t.super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
  super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::Expr,_std::default_delete<wabt::Expr>,_true,_true>)
       (__uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>)0x0;
  RVar7 = ParsePlainInstr(this,&local_a8);
  if ((RVar7.enum_ == Error) || (RVar7 = ParseExprList(this,exprs), RVar7.enum_ == Error)) {
LAB_00136531:
    bVar5 = false;
  }
  else {
    local_108._0_8_ = (Expr *)(local_108 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"an expr","");
    local_88.filename._M_len = 0;
    local_88.filename._M_str = (char *)0x0;
    local_88.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
               (string *)local_108,local_e8);
    bVar5 = Match(this,Lpar);
    if (bVar5) {
      RVar7 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&local_88,(char *)0x0);
      bVar5 = RVar7.enum_ == Error;
    }
    else {
      bVar5 = false;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_88);
    if ((Expr *)local_108._0_8_ != (Expr *)(local_108 + 0x10)) {
      operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
    }
    uVar4._M_t.super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
         (__uniq_ptr_data<wabt::Expr,_std::default_delete<wabt::Expr>,_true,_true>)
         (__uniq_ptr_data<wabt::Expr,_std::default_delete<wabt::Expr>,_true,_true>)local_a8;
    if (bVar5) goto LAB_00136531;
    local_a8._M_t.super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
         (__uniq_ptr_data<wabt::Expr,_std::default_delete<wabt::Expr>,_true,_true>)
         (__uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>)0x0;
    if ((*(Expr **)((long)uVar4._M_t.
                          super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
                          super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x10) !=
         (Expr *)0x0) ||
       (((intrusive_list_base<wabt::Expr> *)
        ((long)uVar4._M_t.super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
               super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
               super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 8))->next_ != (Expr *)0x0))
    {
      __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/intrusive-list.h"
                    ,0x1bd,
                    "void wabt::intrusive_list<wabt::Expr>::push_back(std::unique_ptr<T>) [T = wabt::Expr]"
                   );
    }
    pEVar9 = exprs->last_;
    pEVar11 = exprs;
    if (pEVar9 != (Expr *)0x0) {
      *(Expr **)((long)uVar4._M_t.
                       super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
                       super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                       super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 0x10) = pEVar9;
      pEVar11 = (ExprList *)&pEVar9->super_intrusive_list_base<wabt::Expr>;
    }
    pEVar11->first_ =
         (Expr *)uVar4._M_t.super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t
                 .super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                 super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    exprs->last_ = (Expr *)uVar4._M_t.
                           super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
                           super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                           super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    exprs->size_ = exprs->size_ + 1;
    bVar5 = true;
  }
  if (local_a8._M_t.super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
      super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
      super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>)0x0) {
    (**(code **)(*(long *)local_a8._M_t.
                          super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
                          super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl + 8))();
  }
joined_r0x00136b1d:
  if (bVar5) {
    RVar8 = Expect(this,Rpar);
    RVar8.enum_ = (Enum)(RVar8.enum_ == Error);
  }
  return (Result)RVar8.enum_;
}

Assistant:

Result WastParser::ParseExpr(ExprList* exprs) {
  WABT_TRACE(ParseExpr);
  if (!PeekMatch(TokenType::Lpar)) {
    return Result::Error;
  }

  if (IsPlainInstr(Peek(1))) {
    Consume();
    std::unique_ptr<Expr> expr;
    CHECK_RESULT(ParsePlainInstr(&expr));
    CHECK_RESULT(ParseExprList(exprs));
    CHECK_RESULT(ErrorIfLpar({"an expr"}));
    exprs->push_back(std::move(expr));
  } else {
    Location loc = GetLocation();

    switch (Peek(1)) {
      case TokenType::Block: {
        Consume();
        Consume();
        auto expr = std::make_unique<BlockExpr>(loc);
        CHECK_RESULT(ParseLabelOpt(&expr->block.label));
        CHECK_RESULT(ParseBlock(&expr->block));
        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::Loop: {
        Consume();
        Consume();
        auto expr = std::make_unique<LoopExpr>(loc);
        CHECK_RESULT(ParseLabelOpt(&expr->block.label));
        CHECK_RESULT(ParseBlock(&expr->block));
        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::If: {
        Consume();
        Consume();
        auto expr = std::make_unique<IfExpr>(loc);

        CHECK_RESULT(ParseLabelOpt(&expr->true_.label));
        CHECK_RESULT(ParseBlockDeclaration(&expr->true_.decl));

        while (PeekMatchExpr()) {
          ExprList cond;
          CHECK_RESULT(ParseExpr(&cond));
          exprs->splice(exprs->end(), cond);
        }

        EXPECT(Lpar);
        if (!Match(TokenType::Then)) {
          return ErrorExpected({"then block"}, "(then ...)");
        }

        CHECK_RESULT(ParseTerminatingInstrList(&expr->true_.exprs));
        expr->true_.end_loc = GetLocation();
        EXPECT(Rpar);

        if (MatchLpar(TokenType::Else)) {
          CHECK_RESULT(ParseTerminatingInstrList(&expr->false_));
          EXPECT(Rpar);
        }
        expr->false_end_loc = GetLocation();

        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::Try: {
        Consume();
        ErrorUnlessOpcodeEnabled(Consume());

        auto expr = std::make_unique<TryExpr>(loc);
        CHECK_RESULT(ParseLabelOpt(&expr->block.label));
        CHECK_RESULT(ParseBlockDeclaration(&expr->block.decl));
        EXPECT(Lpar);
        EXPECT(Do);
        CHECK_RESULT(ParseInstrList(&expr->block.exprs));
        EXPECT(Rpar);
        if (PeekMatch(TokenType::Lpar)) {
          Consume();
          TokenType type = Peek();
          switch (type) {
            case TokenType::Catch:
            case TokenType::CatchAll:
              CHECK_RESULT(ParseCatchExprList(&expr->catches));
              expr->kind = TryKind::Catch;
              break;
            case TokenType::Delegate: {
              Consume();
              Var var;
              CHECK_RESULT(ParseVar(&var));
              expr->delegate_target = var;
              expr->kind = TryKind::Delegate;
              EXPECT(Rpar);
              break;
            }
            default:
              ErrorExpected({"catch", "catch_all", "delegate"});
              break;
          }
        }
        CHECK_RESULT(ErrorIfLpar({"a valid try clause"}));
        expr->block.end_loc = GetLocation();
        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::TryTable: {
        Consume();
        ErrorUnlessOpcodeEnabled(Consume());
        auto expr = std::make_unique<TryTableExpr>(loc);
        CHECK_RESULT(ParseLabelOpt(&expr->block.label));
        CHECK_RESULT(ParseBlockDeclaration(&expr->block.decl));
        CHECK_RESULT(ParseTryTableCatches(&expr->catches));
        CHECK_RESULT(ParseInstrList(&expr->block.exprs));
        expr->block.end_loc = GetLocation();
        exprs->push_back(std::move(expr));
        break;
      }

      default:
        assert(!"ParseExpr should only be called when IsExpr() is true");
        return Result::Error;
    }
  }

  EXPECT(Rpar);
  return Result::Ok;
}